

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::ProfiledNewScArray
              (uint32 elementCount,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  bool bVar1;
  ThreadContext *pTVar2;
  JavascriptLibrary *this;
  bool bVar3;
  JavascriptNativeArray *this_00;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  bVar3 = ArrayCallSiteInfo::IsNativeIntArray(arrayInfo);
  if (bVar3) {
    this_00 = &JavascriptLibrary::CreateNativeIntArrayLiteral
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary,elementCount)->
               super_JavascriptNativeArray;
    JavascriptNativeArray::SetArrayProfileInfo(this_00,weakFuncRef,arrayInfo);
  }
  else {
    bVar3 = ArrayCallSiteInfo::IsNativeFloatArray(arrayInfo);
    this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    if (bVar3) {
      this_00 = &JavascriptLibrary::CreateNativeFloatArrayLiteral(this,elementCount)->
                 super_JavascriptNativeArray;
      JavascriptNativeArray::SetArrayProfileInfo(this_00,weakFuncRef,arrayInfo);
    }
    else {
      this_00 = (JavascriptNativeArray *)JavascriptLibrary::CreateArrayLiteral(this,elementCount);
    }
  }
  pTVar2->noJsReentrancy = bVar1;
  return this_00;
}

Assistant:

Var JavascriptArray::ProfiledNewScArray(uint32 elementCount, ScriptContext *scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewScArray, reentrancylock, scriptContext->GetThreadContext());
        if (arrayInfo->IsNativeIntArray())
        {
            JavascriptNativeIntArray *arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(elementCount);
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        if (arrayInfo->IsNativeFloatArray())
        {
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(elementCount);
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(elementCount);
        return arr;
        JIT_HELPER_END(ScrArr_ProfiledNewScArray);
    }